

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboTestUtil::GradientShader::GradientShader
          (GradientShader *this,DataType outputType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  ShaderProgramDeclaration *pSVar3;
  long *plVar4;
  long *plVar5;
  long *local_370;
  long local_360;
  undefined4 uStack_358;
  undefined4 uStack_354;
  long *local_350;
  long local_348;
  long local_340 [2];
  long *local_330;
  long local_328;
  long local_320 [2];
  long *local_310;
  long local_308;
  long local_300 [2];
  long *local_2f0;
  long local_2e8;
  long local_2e0 [2];
  long *local_2d0;
  long local_2c8;
  long local_2c0 [2];
  long *local_2b0 [2];
  long local_2a0 [2];
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  VertexSource local_270;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  FragmentOutput local_20c;
  Uniform local_208;
  Uniform local_1e0;
  VertexAttribute local_1b8;
  VertexAttribute local_190;
  FragmentSource local_168;
  VertexToFragmentVarying local_148;
  ShaderProgramDeclaration local_140;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"a_position","");
  local_190.name._M_dataplus._M_p = (pointer)&local_190.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_2d0,local_2c8 + (long)local_2d0);
  local_190.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_190);
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"a_coord","");
  local_1b8.name._M_dataplus._M_p = (pointer)&local_1b8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_2f0,local_2e8 + (long)local_2f0);
  local_1b8.type = GENERICVECTYPE_FLOAT;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_1b8);
  local_148.type = GENERICVECTYPE_FLOAT;
  local_148.flatshade = false;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_148);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_20c.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_20c.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_20c.type = GENERICVECTYPE_INT32;
  }
  else {
    local_20c.type = GENERICVECTYPE_LAST;
  }
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_20c);
  local_310 = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"u_gradientMin","");
  local_1e0.name._M_dataplus._M_p = (pointer)&local_1e0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_310,local_308 + (long)local_310);
  local_1e0.type = TYPE_FLOAT_VEC4;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_1e0);
  local_330 = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"u_gradientMax","");
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_330,local_328 + (long)local_330);
  local_208.type = TYPE_FLOAT_VEC4;
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_208);
  local_350 = local_340;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_350,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coord;\nout highp vec4 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  local_270.source._M_dataplus._M_p = (pointer)&local_270.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_350,local_348 + (long)local_350);
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_270);
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b0,
             "#version 300 es\nin highp vec4 v_coord;\nuniform highp vec4 u_gradientMin;\nuniform highp vec4 u_gradientMax;\nlayout(location = 0) out highp "
             ,"");
  glu::getDataTypeName(outputType);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_2b0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_240 = *plVar5;
    lStack_238 = plVar4[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *plVar5;
    local_250 = (long *)*plVar4;
  }
  local_248 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_250);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_280 = *plVar5;
    lStack_278 = plVar4[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *plVar5;
    local_290 = (long *)*plVar4;
  }
  local_288 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  glu::getDataTypeName(outputType);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_290);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_220 = *plVar5;
    lStack_218 = plVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar5;
    local_230 = (long *)*plVar4;
  }
  local_228 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_360 = *plVar5;
    uStack_358 = (undefined4)plVar4[3];
    uStack_354 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_370 = &local_360;
  }
  else {
    local_360 = *plVar5;
    local_370 = (long *)*plVar4;
  }
  lVar2 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar1 = &local_168.source.field_2;
  local_168.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_370,lVar2 + (long)local_370);
  pSVar3 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar3,&local_168);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.source._M_dataplus._M_p,
                    local_168.source.field_2._M_allocated_capacity + 1);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0],local_2a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.source._M_dataplus._M_p != &local_270.source.field_2) {
    operator_delete(local_270.source._M_dataplus._M_p,
                    local_270.source.field_2._M_allocated_capacity + 1);
  }
  if (local_350 != local_340) {
    operator_delete(local_350,local_340[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,local_208.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.name._M_dataplus._M_p != &local_1e0.name.field_2) {
    operator_delete(local_1e0.name._M_dataplus._M_p,local_1e0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_310 != local_300) {
    operator_delete(local_310,local_300[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.name._M_dataplus._M_p != &local_1b8.name.field_2) {
    operator_delete(local_1b8.name._M_dataplus._M_p,local_1b8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.name._M_dataplus._M_p != &local_190.name.field_2) {
    operator_delete(local_190.name._M_dataplus._M_p,local_190.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0,local_2c0[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_0219b8e8;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_0219b920;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_0219b938;
  *(DataType *)&(this->super_ShaderProgram).field_0x154 = outputType;
  return;
}

Assistant:

GradientShader::GradientShader (glu::DataType outputType)
	: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
					<< sglr::pdec::Uniform("u_gradientMin", glu::TYPE_FLOAT_VEC4)
					<< sglr::pdec::Uniform("u_gradientMax", glu::TYPE_FLOAT_VEC4)
					<< sglr::pdec::VertexSource(
							"#version 300 es\n"
							"in highp vec4 a_position;\n"
							"in highp vec4 a_coord;\n"
							"out highp vec4 v_coord;\n"
							"void main (void)\n"
							"{\n"
							"	gl_Position = a_position;\n"
							"	v_coord = a_coord;\n"
							"}\n")
					<< sglr::pdec::FragmentSource(
							string(
								"#version 300 es\n"
								"in highp vec4 v_coord;\n"
								"uniform highp vec4 u_gradientMin;\n"
								"uniform highp vec4 u_gradientMax;\n"
								"layout(location = 0) out highp ") + glu::getDataTypeName(outputType) + " o_color;\n"
								"void main (void)\n"
								"{\n"
								"	highp float x = v_coord.x;\n"
								"	highp float y = v_coord.y;\n"
								"	highp float f0 = (x + y) * 0.5;\n"
								"	highp float f1 = 0.5 + (x - y) * 0.5;\n"
								"	highp vec4 fv = vec4(f0, f1, 1.0f-f0, 1.0f-f1);\n"
								"	o_color = " + glu::getDataTypeName(outputType) + "(u_gradientMin + (u_gradientMax-u_gradientMin)*fv);\n"
								"}\n"))
	, m_outputType(outputType)
{
}